

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshTopology::GetTopFaceVertices(ON_MeshTopology *this,int fi,int *topvi)

{
  ON_MeshFace *pOVar1;
  int *piVar2;
  
  if ((-1 < fi) && (fi < (this->m_mesh->m_F).m_count)) {
    pOVar1 = (this->m_mesh->m_F).m_a;
    piVar2 = (this->m_topv_map).m_a;
    *topvi = piVar2[pOVar1[(uint)fi].vi[0]];
    topvi[1] = piVar2[pOVar1[(uint)fi].vi[1]];
    topvi[2] = piVar2[pOVar1[(uint)fi].vi[2]];
    topvi[3] = piVar2[pOVar1[(uint)fi].vi[3]];
  }
  return true;
}

Assistant:

bool ON_MeshTopology::GetTopFaceVertices( int fi, int topvi[4] ) const
{
  if ( fi >= 0 && fi < m_mesh->m_F.Count() ) {
    const int* fvi = m_mesh->m_F[fi].vi;
    topvi[0] = m_topv_map[fvi[0]];
    topvi[1] = m_topv_map[fvi[1]];
    topvi[2] = m_topv_map[fvi[2]];
    topvi[3] = m_topv_map[fvi[3]];
  }
  return true;
}